

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<32U,_unsigned_char,_void,_true>::uintwide_t<int>
          (uintwide_t<32U,_unsigned_char,_void,_true> *this,int v,
          enable_if_t<(std::is_integral<int>::value_&&_std::is_signed<int>::value)> *p_nullparam)

{
  array<unsigned_char,_4UL> local_1c;
  
  detail::fixed_static_array<unsigned_char,_4U>::fixed_static_array(&this->values,4);
  if (v < 0) {
    uintwide_t<32u,unsigned_char,void,true>::uintwide_t<unsigned_int>(unsigned_int,std::
    enable_if<(std::is_integral<unsigned_int>::value&&std::is_unsigned<unsigned_int>::value)&&((std
    ::numeric_limits<unsigned_int>::digits>std::numeric_limits<unsigned_char>::digits)),void>::
    type__(&local_1c,-v,
           (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
            *)0x0);
    *&(this->values).super_array<unsigned_char,_4UL>.elems = local_1c.elems;
    negate(this);
  }
  else {
    uintwide_t<32u,unsigned_char,void,true>::uintwide_t<unsigned_int>(unsigned_int,std::
    enable_if<(std::is_integral<unsigned_int>::value&&std::is_unsigned<unsigned_int>::value)&&((std
    ::numeric_limits<unsigned_int>::digits>std::numeric_limits<unsigned_char>::digits)),void>::
    type__(&local_1c,v,
           (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
            *)0x0);
    *&(this->values).super_array<unsigned_char,_4UL>.elems = local_1c.elems;
  }
  return;
}

Assistant:

constexpr uintwide_t(const SignedIntegralType v, // NOLINT(google-explicit-constructor,hicpp-explicit-conversions)
                         std::enable_if_t<(   std::is_integral<SignedIntegralType>::value
                                           && std::is_signed  <SignedIntegralType>::value)>* p_nullparam = nullptr)
      : values(number_of_limbs)
    {
      static_cast<void>(p_nullparam == nullptr);

      using local_signed_integral_type   = SignedIntegralType;
      using local_unsigned_integral_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_signed_integral_type>::digits + 1)>::exact_unsigned_type;

      const auto v_is_neg = (v < static_cast<local_signed_integral_type>(0));

      const local_unsigned_integral_type u =
        ((!v_is_neg) ? static_cast<local_unsigned_integral_type>(v)
                     : static_cast<local_unsigned_integral_type>(detail::negate(v)));

      operator=(uintwide_t(u));

      if(v_is_neg) { negate(); }
    }